

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O2

timeType __thiscall sjtu::timeType::operator+(timeType *this,int *time)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int *in_RDX;
  uint *puVar4;
  timeType tVar5;
  
  iVar1 = (*in_RDX + time[3]) / 0x3c + time[2];
  this->minute = (*in_RDX + time[3]) % 0x3c;
  uVar2 = (long)iVar1 / 0x18 & 0xffffffff;
  this->hour = iVar1 % 0x18;
  iVar1 = time[1];
  uVar3 = (ulong)*time;
  puVar4 = (uint *)(months + uVar3 * 4);
  while( true ) {
    iVar1 = (int)uVar2 + iVar1;
    if (iVar1 <= (int)*puVar4) break;
    uVar2 = (ulong)(iVar1 + ~*puVar4);
    uVar3 = (ulong)((int)uVar3 + 1);
    puVar4 = puVar4 + 1;
    iVar1 = 1;
  }
  this->month = (int)uVar3;
  this->day = iVar1;
  tVar5._8_8_ = puVar4;
  tVar5._0_8_ = this;
  return tVar5;
}

Assistant:

timeType timeType::operator+(const int &time) const {
        	timeType ret;
                ret.minute = minute + time , ret.hour = hour + ret.minute / 60 , ret.minute %= 60;
                int day_add = ret.hour / 24;ret.hour %= 24;
                for (ret.day = day , ret.month = month;day_add + ret.day > months[ret.month];++ ret.month) day_add -= months[ret.month] - ret.day + 1 , ret.day = 1;
                ret.day += day_add;
        	return ret;
        }